

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_tpl_dealloc(AV1TplRowMultiThreadSync *tpl_sync)

{
  long *in_RDI;
  int i_1;
  int i;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (*in_RDI != 0) {
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(int *)((long)in_RDI + 0x1c);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      pthread_mutex_destroy((pthread_mutex_t *)(*in_RDI + (long)in_stack_fffffffffffffff4 * 0x28));
    }
    aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  if (in_RDI[1] != 0) {
    for (in_stack_fffffffffffffff0 = 0; in_stack_fffffffffffffff0 < *(int *)((long)in_RDI + 0x1c);
        in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
      pthread_cond_destroy((pthread_cond_t *)(in_RDI[1] + (long)in_stack_fffffffffffffff0 * 0x30));
    }
    aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  memset(in_RDI,0,0x28);
  return;
}

Assistant:

void av1_tpl_dealloc(AV1TplRowMultiThreadSync *tpl_sync) {
  assert(tpl_sync != NULL);

#if CONFIG_MULTITHREAD
  if (tpl_sync->mutex_ != NULL) {
    for (int i = 0; i < tpl_sync->rows; ++i)
      pthread_mutex_destroy(&tpl_sync->mutex_[i]);
    aom_free(tpl_sync->mutex_);
  }
  if (tpl_sync->cond_ != NULL) {
    for (int i = 0; i < tpl_sync->rows; ++i)
      pthread_cond_destroy(&tpl_sync->cond_[i]);
    aom_free(tpl_sync->cond_);
  }
#endif  // CONFIG_MULTITHREAD

  aom_free(tpl_sync->num_finished_cols);
  // clear the structure as the source of this call may be a resize in which
  // case this call will be followed by an _alloc() which may fail.
  av1_zero(*tpl_sync);
}